

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O2

FT_Error FT_Stroker_GetBorderCounts
                   (FT_Stroker stroker,FT_StrokerBorder border,FT_UInt *anum_points,
                   FT_UInt *anum_contours)

{
  FT_Error FVar1;
  FT_UInt local_20;
  FT_UInt local_1c;
  FT_UInt num_points;
  FT_UInt num_contours;
  
  local_20 = 0;
  local_1c = 0;
  if (border < 2 && stroker != (FT_Stroker)0x0) {
    ft_stroke_border_get_counts(stroker->borders + border,&local_20,&local_1c);
    FVar1 = 0;
  }
  else {
    FVar1 = 6;
  }
  if (anum_points != (FT_UInt *)0x0) {
    *anum_points = local_20;
  }
  if (anum_contours != (FT_UInt *)0x0) {
    *anum_contours = local_1c;
  }
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_GetBorderCounts( FT_Stroker        stroker,
                              FT_StrokerBorder  border,
                              FT_UInt          *anum_points,
                              FT_UInt          *anum_contours )
  {
    FT_UInt   num_points = 0, num_contours = 0;
    FT_Error  error;


    if ( !stroker || border > 1 )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    error = ft_stroke_border_get_counts( stroker->borders + border,
                                         &num_points, &num_contours );
  Exit:
    if ( anum_points )
      *anum_points = num_points;

    if ( anum_contours )
      *anum_contours = num_contours;

    return error;
  }